

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void finish_ra(gen_ctx_t gen_ctx)

{
  size_t sVar1;
  bitmap_t pVVar2;
  gen_ctx_t gen_ctx_local;
  
  VARR_MIR_reg_tdestroy(&gen_ctx->ra_ctx->reg_renumber);
  VARR_allocno_info_tdestroy(&gen_ctx->ra_ctx->sorted_regs);
  while( true ) {
    sVar1 = VARR_bitmap_tlength(gen_ctx->ra_ctx->used_locs);
    if (sVar1 == 0) break;
    pVVar2 = VARR_bitmap_tpop(gen_ctx->ra_ctx->used_locs);
    bitmap_destroy(pVVar2);
  }
  VARR_bitmap_tdestroy(&gen_ctx->ra_ctx->used_locs);
  while( true ) {
    sVar1 = VARR_bitmap_tlength(gen_ctx->ra_ctx->busy_used_locs);
    if (sVar1 == 0) break;
    pVVar2 = VARR_bitmap_tpop(gen_ctx->ra_ctx->busy_used_locs);
    bitmap_destroy(pVVar2);
  }
  VARR_bitmap_tdestroy(&gen_ctx->ra_ctx->busy_used_locs);
  while( true ) {
    sVar1 = VARR_bitmap_tlength(gen_ctx->ra_ctx->var_bbs);
    if (sVar1 == 0) break;
    pVVar2 = VARR_bitmap_tpop(gen_ctx->ra_ctx->var_bbs);
    bitmap_destroy(pVVar2);
  }
  VARR_bitmap_tdestroy(&gen_ctx->ra_ctx->var_bbs);
  VARR_lr_gap_tdestroy(&gen_ctx->ra_ctx->spill_gaps);
  VARR_lr_gap_tdestroy(&gen_ctx->ra_ctx->curr_gaps);
  VARR_spill_el_tdestroy(&gen_ctx->ra_ctx->spill_els);
  finish_lr_gap_tab(gen_ctx);
  VARR_spill_cache_el_tdestroy(&gen_ctx->ra_ctx->spill_cache);
  bitmap_destroy(gen_ctx->ra_ctx->conflict_locs1);
  free(gen_ctx->ra_ctx);
  gen_ctx->ra_ctx = (ra_ctx *)0x0;
  return;
}

Assistant:

static void finish_ra (gen_ctx_t gen_ctx) {
  VARR_DESTROY (MIR_reg_t, reg_renumber);
  VARR_DESTROY (allocno_info_t, sorted_regs);
  while (VARR_LENGTH (bitmap_t, used_locs) != 0) bitmap_destroy (VARR_POP (bitmap_t, used_locs));
  VARR_DESTROY (bitmap_t, used_locs);
  while (VARR_LENGTH (bitmap_t, busy_used_locs) != 0)
    bitmap_destroy (VARR_POP (bitmap_t, busy_used_locs));
  VARR_DESTROY (bitmap_t, busy_used_locs);
  while (VARR_LENGTH (bitmap_t, var_bbs) != 0) bitmap_destroy (VARR_POP (bitmap_t, var_bbs));
  VARR_DESTROY (bitmap_t, var_bbs);
  VARR_DESTROY (lr_gap_t, spill_gaps);
  VARR_DESTROY (lr_gap_t, curr_gaps);
  VARR_DESTROY (spill_el_t, spill_els);
  finish_lr_gap_tab (gen_ctx);
  VARR_DESTROY (spill_cache_el_t, spill_cache);
  bitmap_destroy (conflict_locs1);
  free (gen_ctx->ra_ctx);
  gen_ctx->ra_ctx = NULL;
}